

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless_sse2.c
# Opt level: O1

void PredictorAdd11_SSE2(uint32_t *in,uint32_t *upper,int num_pixels,uint32_t *out)

{
  uint32_t *puVar1;
  undefined1 auVar2 [16];
  char cVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  undefined1 auVar15 [16];
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined8 uVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined4 uVar35;
  undefined1 auVar36 [16];
  undefined1 auVar38 [16];
  undefined1 auVar40 [16];
  undefined1 auVar42 [16];
  undefined1 auVar29 [16];
  undefined1 auVar37 [16];
  undefined1 auVar39 [16];
  undefined1 auVar41 [16];
  undefined1 auVar43 [16];
  
  uVar14 = 0;
  if (3 < num_pixels) {
    auVar27 = ZEXT416(out[-1]);
    uVar13 = 0;
    do {
      auVar15 = *(undefined1 (*) [16])(upper + (uVar13 - 1));
      auVar2 = *(undefined1 (*) [16])(upper + uVar13);
      puVar1 = in + uVar13;
      cVar3 = (char)puVar1[2];
      cVar4 = *(char *)((long)puVar1 + 9);
      cVar5 = *(char *)((long)puVar1 + 10);
      cVar6 = *(char *)((long)puVar1 + 0xb);
      cVar7 = (char)puVar1[3];
      cVar8 = *(char *)((long)puVar1 + 0xd);
      cVar9 = *(char *)((long)puVar1 + 0xe);
      cVar10 = *(char *)((long)puVar1 + 0xf);
      uVar16 = auVar2._0_4_;
      uVar17 = auVar2._4_4_;
      uVar18 = auVar2._8_4_;
      uVar19 = auVar2._12_4_;
      auVar32._4_4_ = uVar16;
      auVar32._0_4_ = uVar16;
      auVar32._8_4_ = uVar17;
      auVar32._12_4_ = uVar17;
      auVar37._0_8_ = auVar15._0_8_;
      auVar37._8_4_ = auVar15._4_4_;
      auVar37._12_4_ = uVar17;
      auVar36._8_8_ = auVar37._8_8_;
      auVar36._0_4_ = auVar15._0_4_;
      auVar36._4_4_ = uVar16;
      auVar23._4_4_ = uVar18;
      auVar23._0_4_ = uVar18;
      auVar23._8_4_ = uVar19;
      auVar23._12_4_ = uVar19;
      auVar25._4_4_ = uVar18;
      auVar25._0_4_ = auVar15._8_4_;
      auVar25._8_4_ = auVar15._12_4_;
      auVar25._12_4_ = uVar19;
      auVar33 = psadbw(auVar32,auVar36);
      auVar23 = psadbw(auVar23,auVar25);
      auVar34 = packssdw(auVar33,auVar23);
      auVar20._0_8_ = auVar27._0_8_;
      auVar20._8_4_ = auVar27._4_4_;
      auVar20._12_4_ = uVar17;
      auVar24._8_8_ = auVar20._8_8_;
      auVar24._0_4_ = auVar27._0_4_;
      auVar24._4_4_ = uVar16;
      auVar33 = psadbw(auVar24,auVar36);
      auVar21._0_4_ = -(uint)(auVar34._0_4_ < auVar33._0_4_);
      auVar21._4_4_ = -(uint)(auVar34._4_4_ < auVar33._4_4_);
      auVar21._8_4_ = -(uint)(auVar34._8_4_ < auVar33._8_4_);
      auVar21._12_4_ = -(uint)(auVar34._12_4_ < auVar33._12_4_);
      auVar27 = ~auVar21 & auVar2 | auVar27 & auVar21;
      uVar16 = CONCAT13(auVar27[3] + *(char *)((long)puVar1 + 3),
                        CONCAT12(auVar27[2] + *(char *)((long)puVar1 + 2),
                                 CONCAT11(auVar27[1] + *(char *)((long)puVar1 + 1),
                                          auVar27[0] + (char)*puVar1)));
      auVar22._0_8_ =
           CONCAT17(auVar27[7] + *(char *)((long)puVar1 + 7),
                    CONCAT16(auVar27[6] + *(char *)((long)puVar1 + 6),
                             CONCAT15(auVar27[5] + *(char *)((long)puVar1 + 5),
                                      CONCAT14(auVar27[4] + (char)puVar1[1],uVar16))));
      auVar22[8] = auVar27[8] + cVar3;
      auVar22[9] = auVar27[9] + cVar4;
      auVar22[10] = auVar27[10] + cVar5;
      auVar22[0xb] = auVar27[0xb] + cVar6;
      auVar22[0xc] = auVar27[0xc] + cVar7;
      auVar22[0xd] = auVar27[0xd] + cVar8;
      auVar22[0xe] = auVar27[0xe] + cVar9;
      auVar22[0xf] = auVar27[0xf] + cVar10;
      auVar39._0_8_ = auVar15._4_8_;
      auVar43._8_4_ = (int)((ulong)auVar22._0_8_ >> 0x20);
      auVar43._0_8_ = auVar22._0_8_;
      auVar43._12_4_ = uVar18;
      auVar42._8_8_ = auVar43._8_8_;
      auVar42._4_4_ = uVar17;
      auVar42._0_4_ = uVar16;
      auVar39._8_4_ = auVar15._8_4_;
      auVar39._12_4_ = uVar18;
      auVar38._8_8_ = auVar39._8_8_;
      auVar38._4_4_ = uVar17;
      auVar38._0_4_ = auVar15._4_4_;
      auVar27 = psadbw(auVar38,auVar42);
      auVar40._0_4_ = -(uint)(auVar34._4_4_ < auVar27._0_4_);
      auVar40._4_4_ = -(uint)(auVar34._8_4_ < auVar27._4_4_);
      auVar40._8_4_ = -(uint)(auVar34._12_4_ < auVar27._8_4_);
      auVar40._12_4_ = -(uint)(0 < auVar27._12_4_);
      auVar27 = ~auVar40 & auVar2 >> 0x20 | auVar22 & auVar40;
      uVar35 = CONCAT13(auVar27[3] + *(char *)((long)puVar1 + 7),
                        CONCAT12(auVar27[2] + *(char *)((long)puVar1 + 6),
                                 CONCAT11(auVar27[1] + *(char *)((long)puVar1 + 5),
                                          auVar27[0] + (char)puVar1[1])));
      auVar41._0_8_ =
           CONCAT17(auVar27[7] + cVar6,
                    CONCAT16(auVar27[6] + cVar5,
                             CONCAT15(auVar27[5] + cVar4,CONCAT14(auVar27[4] + cVar3,uVar35))));
      auVar41[8] = auVar27[8] + cVar7;
      auVar41[9] = auVar27[9] + cVar8;
      auVar41[10] = auVar27[10] + cVar9;
      auVar41[0xb] = auVar27[0xb] + cVar10;
      auVar41[0xc] = auVar27[0xc];
      auVar41[0xd] = auVar27[0xd];
      auVar41[0xe] = auVar27[0xe];
      auVar41[0xf] = auVar27[0xf];
      auVar24 = packssdw(auVar23,(undefined1  [16])0x0);
      auVar29._8_4_ = (int)((ulong)auVar41._0_8_ >> 0x20);
      auVar29._0_8_ = auVar41._0_8_;
      auVar29._12_4_ = uVar19;
      auVar28._8_8_ = auVar29._8_8_;
      auVar28._4_4_ = uVar18;
      auVar28._0_4_ = uVar35;
      auVar27 = psadbw(auVar28,auVar25);
      auVar30._0_4_ = -(uint)(auVar24._0_4_ < auVar27._0_4_);
      auVar30._4_4_ = -(uint)(auVar24._4_4_ < auVar27._4_4_);
      auVar30._8_4_ = -(uint)(auVar24._8_4_ < auVar27._8_4_);
      auVar30._12_4_ = -(uint)(auVar24._12_4_ < auVar27._12_4_);
      auVar27 = ~auVar30 & auVar2 >> 0x40 | auVar41 & auVar30;
      uVar17 = CONCAT13(auVar27[3] + cVar6,
                        CONCAT12(auVar27[2] + cVar5,CONCAT11(auVar27[1] + cVar4,auVar27[0] + cVar3))
                       );
      auVar31._0_8_ =
           CONCAT17(auVar27[7] + cVar10,
                    CONCAT16(auVar27[6] + cVar9,
                             CONCAT15(auVar27[5] + cVar8,CONCAT14(auVar27[4] + cVar7,uVar17))));
      auVar31[8] = auVar27[8];
      auVar31[9] = auVar27[9];
      auVar31[10] = auVar27[10];
      auVar31[0xb] = auVar27[0xb];
      auVar31[0xc] = auVar27[0xc];
      auVar31[0xd] = auVar27[0xd];
      auVar31[0xe] = auVar27[0xe];
      auVar31[0xf] = auVar27[0xf];
      auVar34._4_4_ = uVar19;
      auVar34._0_4_ = uVar17;
      auVar34._8_4_ = (int)((ulong)auVar31._0_8_ >> 0x20);
      auVar34._12_4_ = 0;
      auVar33._4_4_ = uVar19;
      auVar33._0_4_ = auVar15._12_4_;
      auVar33._8_8_ = 0;
      auVar27 = psadbw(auVar33,auVar34);
      auVar15._0_4_ = -(uint)(auVar24._4_4_ < auVar27._0_4_);
      auVar15._4_4_ = -(uint)(auVar24._8_4_ < auVar27._4_4_);
      auVar15._8_4_ = -(uint)(auVar24._12_4_ < auVar27._8_4_);
      auVar15._12_4_ = -(uint)(0 < auVar27._12_4_);
      auVar15 = ~auVar15 & auVar2 >> 0x60 | auVar31 & auVar15;
      auVar27._0_4_ =
           CONCAT13(auVar15[3] + cVar10,
                    CONCAT12(auVar15[2] + cVar9,CONCAT11(auVar15[1] + cVar8,auVar15[0] + cVar7)));
      auVar27[4] = auVar15[4];
      auVar27[5] = auVar15[5];
      auVar27[6] = auVar15[6];
      auVar27[7] = auVar15[7];
      auVar27[8] = auVar15[8];
      auVar27[9] = auVar15[9];
      auVar27[10] = auVar15[10];
      auVar27[0xb] = auVar15[0xb];
      auVar27[0xc] = auVar15[0xc];
      auVar27[0xd] = auVar15[0xd];
      auVar27[0xe] = auVar15[0xe];
      auVar27[0xf] = auVar15[0xf];
      uVar26 = CONCAT44(auVar27._0_4_,uVar17);
      *(ulong *)(out + uVar13) = CONCAT44(uVar35,uVar16);
      *(undefined8 *)(out + uVar13 + 2) = uVar26;
      uVar14 = uVar13 + 4;
      uVar12 = uVar13 + 8;
      uVar13 = uVar14;
    } while (uVar12 <= (uint)num_pixels);
  }
  iVar11 = num_pixels - (int)uVar14;
  if (iVar11 == 0) {
    return;
  }
  uVar14 = uVar14 & 0xffffffff;
  (*VP8LPredictorsAdd_C[0xb])(in + uVar14,upper + uVar14,iVar11,out + uVar14);
  return;
}

Assistant:

static void PredictorAdd11_SSE2(const uint32_t* in, const uint32_t* upper,
                                int num_pixels, uint32_t* WEBP_RESTRICT out) {
  int i;
  __m128i pa;
  __m128i L = _mm_cvtsi32_si128((int)out[-1]);
  for (i = 0; i + 4 <= num_pixels; i += 4) {
    __m128i T = _mm_loadu_si128((const __m128i*)&upper[i]);
    __m128i TL = _mm_loadu_si128((const __m128i*)&upper[i - 1]);
    __m128i src = _mm_loadu_si128((const __m128i*)&in[i]);
    {
      // We can unpack with any value on the upper 32 bits, provided it's the
      // same on both operands (so that their sum of abs diff is zero). Here we
      // use T.
      const __m128i T_lo = _mm_unpacklo_epi32(T, T);
      const __m128i TL_lo = _mm_unpacklo_epi32(TL, T);
      const __m128i T_hi = _mm_unpackhi_epi32(T, T);
      const __m128i TL_hi = _mm_unpackhi_epi32(TL, T);
      const __m128i s_lo = _mm_sad_epu8(T_lo, TL_lo);
      const __m128i s_hi = _mm_sad_epu8(T_hi, TL_hi);
      pa = _mm_packs_epi32(s_lo, s_hi);  // pa = sum |T-TL|
    }
    DO_PRED11(0);
    DO_PRED11_SHIFT;
    DO_PRED11(1);
    DO_PRED11_SHIFT;
    DO_PRED11(2);
    DO_PRED11_SHIFT;
    DO_PRED11(3);
  }
  if (i != num_pixels) {
    VP8LPredictorsAdd_C[11](in + i, upper + i, num_pixels - i, out + i);
  }
}